

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

void crnlib::rg_etc1::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint table_idx)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  component_t cVar11;
  int iVar12;
  
  uVar5 = (ulong)table_idx;
  uVar9 = packed_color5 >> 7 & 0xf8 | packed_color5 >> 0xc & 7;
  uVar4 = packed_color5 >> 2 & 0xf8 | packed_color5 >> 7 & 7;
  uVar3 = ((packed_color5 & 0x1c) >> 2) + (uint)packed_color5 * 8 & 0xff;
  iVar7 = (&g_etc1_inten_tables)[uVar5 * 4];
  iVar10 = 0;
  iVar6 = iVar7 + uVar9;
  if ((int)(iVar7 + uVar9) < 1) {
    iVar6 = iVar10;
  }
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  iVar12 = iVar7 + uVar4;
  if ((int)(iVar7 + uVar4) < 1) {
    iVar12 = iVar10;
  }
  iVar8 = 0xff;
  if (0xfe < iVar12) {
    iVar12 = iVar8;
  }
  iVar1 = (&DAT_001b28d4)[uVar5 * 4];
  iVar2 = iVar7 + uVar3;
  if ((int)(iVar7 + uVar3) < 1) {
    iVar2 = iVar10;
  }
  (pDst->field_0).field_0.r = (component_t)iVar6;
  if (0xfe < iVar2) {
    iVar2 = iVar8;
  }
  (pDst->field_0).field_0.g = (component_t)iVar12;
  (pDst->field_0).field_0.b = (component_t)iVar2;
  iVar7 = iVar1 + uVar9;
  if ((int)(iVar1 + uVar9) < 1) {
    iVar7 = iVar10;
  }
  if (0xfe < iVar7) {
    iVar7 = iVar8;
  }
  (pDst->field_0).field_0.a = 0xff;
  iVar6 = iVar1 + uVar4;
  if ((int)(iVar1 + uVar4) < 1) {
    iVar6 = iVar10;
  }
  pDst[1].field_0.field_0.r = (component_t)iVar7;
  cVar11 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar11 = 0xff;
  }
  pDst[1].field_0.field_0.g = cVar11;
  iVar7 = iVar1 + uVar3;
  if ((int)(iVar1 + uVar3) < 1) {
    iVar7 = iVar10;
  }
  cVar11 = (component_t)iVar7;
  if (0xfe < iVar7) {
    cVar11 = 0xff;
  }
  pDst[1].field_0.field_0.b = cVar11;
  pDst[1].field_0.field_0.a = 0xff;
  iVar7 = *(int *)(&DAT_001b28d8 + uVar5 * 0x10);
  iVar6 = iVar7 + uVar9;
  if ((int)(iVar7 + uVar9) < 1) {
    iVar6 = iVar10;
  }
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  iVar12 = iVar7 + uVar4;
  if ((int)(iVar7 + uVar4) < 1) {
    iVar12 = iVar10;
  }
  pDst[2].field_0.field_0.r = (component_t)iVar6;
  cVar11 = (component_t)iVar12;
  if (0xfe < iVar12) {
    cVar11 = 0xff;
  }
  pDst[2].field_0.field_0.g = cVar11;
  iVar6 = iVar7 + uVar3;
  if ((int)(iVar7 + uVar3) < 1) {
    iVar6 = iVar10;
  }
  cVar11 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar11 = 0xff;
  }
  pDst[2].field_0.field_0.b = cVar11;
  pDst[2].field_0.field_0.a = 0xff;
  iVar7 = *(int *)(&DAT_001b28dc + uVar5 * 0x10);
  iVar6 = uVar9 + iVar7;
  if ((int)(uVar9 + iVar7) < 1) {
    iVar6 = iVar10;
  }
  cVar11 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar11 = 0xff;
  }
  pDst[3].field_0.field_0.r = cVar11;
  iVar6 = uVar4 + iVar7;
  if ((int)(uVar4 + iVar7) < 1) {
    iVar6 = iVar10;
  }
  cVar11 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar11 = 0xff;
  }
  pDst[3].field_0.field_0.g = cVar11;
  iVar6 = uVar3 + iVar7;
  if ((int)(uVar3 + iVar7) < 1) {
    iVar6 = iVar10;
  }
  cVar11 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar11 = 0xff;
  }
  pDst[3].field_0.field_0.b = cVar11;
  pDst[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint table_idx)
        {
            RG_ETC1_ASSERT(table_idx < cETC1IntenModifierValues);
            const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

            uint r, g, b;
            unpack_color5(r, g, b, packed_color5, true);

            const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

            const int y0 = pInten_modifer_table[0];
            pDst[0].set(ir + y0, ig + y0, ib + y0);

            const int y1 = pInten_modifer_table[1];
            pDst[1].set(ir + y1, ig + y1, ib + y1);

            const int y2 = pInten_modifer_table[2];
            pDst[2].set(ir + y2, ig + y2, ib + y2);

            const int y3 = pInten_modifer_table[3];
            pDst[3].set(ir + y3, ig + y3, ib + y3);
        }